

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O2

void test_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  uint hdunum1;
  FitsKey **ppFVar1;
  FitsKey *pFVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  ushort **ppuVar6;
  uint hdunum2;
  int k;
  int local_40;
  int n;
  long local_38;
  
  hdunum1 = hduptr->hdunum;
  local_40 = hduptr->tkeys;
  ppFVar1 = hduptr->kwds;
  hdunum2 = hdunum1;
  while (1 < (int)hdunum2) {
    hdunum2 = hdunum2 - 1;
    iVar4 = test_hduname(hdunum1,hdunum2);
    if (iVar4 != 0) {
      sprintf(comm,"The HDU %d and %d have identical type/name/version",(ulong)hdunum1,
              (ulong)hdunum2);
      wrtwrn(out,comm,0);
    }
  }
  builtin_strncpy(temp,"PCOUNT",7);
  ptemp = temp;
  key_match(tmpkwds,local_40,&ptemp,1,&k,&n);
  if ((long)k < 0) {
    builtin_strncpy(errmes + 0x10,"PCOUNT keyword.",0x10);
    builtin_strncpy(errmes,"cannot find the ",0x10);
    wrterr(out,errmes,1);
  }
  else {
    pFVar2 = hduptr->kwds[k];
    iVar4 = check_int(pFVar2,out);
    if (iVar4 != 0) {
      dVar3 = atof(pFVar2->kvalue);
      hduptr->pcount = (long)dVar3;
    }
    iVar4 = pFVar2->kindex;
    if (iVar4 != hduptr->naxis + 4) {
      sprintf(errmes,"PCOUNT is not in record %d of the header.");
      wrterr(out,errmes,1);
      iVar4 = pFVar2->kindex;
    }
    check_fixed_int(cards[(long)iVar4 + -1],out);
  }
  builtin_strncpy(temp,"GCOUNT",7);
  ptemp = temp;
  key_match(tmpkwds,local_40,&ptemp,1,&k,&n);
  if ((long)k < 0) {
    builtin_strncpy(errmes + 0x10,"GCOUNT keyword.",0x10);
    builtin_strncpy(errmes,"cannot find the ",0x10);
    wrterr(out,errmes,1);
  }
  else {
    pFVar2 = hduptr->kwds[k];
    iVar4 = check_int(pFVar2,out);
    if (iVar4 != 0) {
      lVar5 = strtol(pFVar2->kvalue,(char **)0x0,10);
      hduptr->gcount = (int)lVar5;
    }
    iVar4 = pFVar2->kindex;
    if (iVar4 != hduptr->naxis + 5) {
      sprintf(errmes,"GCOUNT is not in record %d of the header.");
      wrterr(out,errmes,1);
      iVar4 = pFVar2->kindex;
    }
    check_fixed_int(cards[(long)iVar4 + -1],out);
  }
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
    strcpy(temp,(char *)((long)&DAT_001c2948 + (long)*(int *)((long)&DAT_001c2948 + lVar5)));
    ptemp = temp;
    key_match(tmpkwds,local_40,&ptemp,1,&k,&n);
    if (-1 < (long)k) {
      sprintf(errmes,"Keyword #%d, %s is not allowed in extensions.",
              (ulong)(uint)hduptr->kwds[k]->kindex);
      wrterr(out,errmes,1);
    }
  }
  for (local_38 = 0; local_38 != 4; local_38 = local_38 + 1) {
    strcpy(temp,(char *)((long)&DAT_001c2954 + (long)(int)(&DAT_001c2954)[local_38]));
    ptemp = temp;
    key_match(tmpkwds,local_40,&ptemp,0,&k,&n);
    lVar5 = (long)k;
    if (-1 < lVar5) {
      iVar4 = n + k;
      for (; (int)lVar5 < iVar4; lVar5 = lVar5 + 1) {
        pFVar2 = ppFVar1[lVar5];
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + (long)pFVar2->kname[5] * 2 + 1) & 8) != 0) {
          sprintf(errmes,"Keyword #%d, %s is only allowed in Random Groups structures.",
                  (ulong)(uint)hduptr->kwds[lVar5]->kindex);
          wrterr(out,errmes,1);
        }
      }
    }
  }
  return;
}

Assistant:

void test_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            ) 
{
    FitsKey *pkey;
    FitsKey **kwds;
    int  i,j,k,n;
    int numusrkey;
    char *exlkey[] = {"SIMPLE","EXTEND", "BLOCKED", }; 
    int nexlkey = 3;
    char *exlnkey[] = {"PTYPE","PSCAL", "PZERO", "GROUPS", }; 
    int nexlnkey = 4;
    int hdunum;
    char *p;

    numusrkey = hduptr->tkeys;
    kwds = hduptr->kwds;
    hdunum = hduptr->hdunum;

    /* check the duplicate extensions */
    for (i = hdunum - 1; i > 0; i--) { 
        if(test_hduname(hdunum,i)) { 
            sprintf(comm, 
	    "The HDU %d and %d have identical type/name/version", 
                hdunum,i);
            wrtwrn(out,comm,0);
        }
    }

    /* check the position of the PCOUNT  */
    strcpy(temp,"PCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the PCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->pcount = (LONGLONG) atof(pkey->kvalue);
        if( pkey->kindex != 4 + hduptr->naxis ) {
	     sprintf(errmes,"PCOUNT is not in record %d of the header.",
                 hduptr->naxis + 4); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    /* check the position of the GCOUNT */
    strcpy(temp,"GCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the GCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->gcount = (int) strtol(pkey->kvalue,NULL,10);
        if( pkey->kindex != 5 + hduptr->naxis ) {
	     sprintf(errmes,"GCOUNT is not in record %d of the header.",
                 hduptr->naxis + 5); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    for (i = 0; i < nexlkey; i++) {
        strcpy(temp,exlkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    	if(k > -1) {
            pkey = hduptr->kwds[k];
            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in extensions.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }

    for (i = 0; i < nexlnkey; i++) {
        strcpy(temp,exlnkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    	if(k > -1) {

          for (j = k; j< k + n ; j++){ 
	    p = kwds[j]->kname; 
	    p += 5;
            if(!isdigit((int)*p)) continue;

            pkey = hduptr->kwds[j];
            sprintf( errmes, 
               "Keyword #%d, %s is only allowed in Random Groups structures.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
          }
        } 
    }

    return;

}